

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::portmap_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,portmap_error_alert *this)

{
  string local_d0;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  portmap_error_alert *local_18;
  portmap_error_alert *this_local;
  
  local_18 = this;
  this_local = (portmap_error_alert *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"could not map port using ",&local_79);
  std::operator+(&local_58,&local_78,
                 *(char **)((anonymous_namespace)::nat_type_str + (ulong)this->map_transport * 8));
  std::operator+(&local_38,&local_58,": ");
  boost::system::error_code::message_abi_cxx11_(&local_d0,&this->error);
  convert_from_native(&local_b0,&local_d0);
  std::operator+(__return_storage_ptr__,&local_38,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::string portmap_error_alert::message() const
	{
		return std::string("could not map port using ")
			+ nat_type_str[static_cast<int>(map_transport)]
			+ ": " + convert_from_native(error.message());
	}